

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch_set.c
# Opt level: O3

int mpt_dispatch_set(mpt_dispatch *disp,uintptr_t id,mpt_event_handler_t cmd,void *arg)

{
  int iVar1;
  mpt_command *pmVar2;
  
  pmVar2 = mpt_command_get(&disp->_d,id);
  if (cmd == (mpt_event_handler_t)0x0) {
    if (pmVar2 == (mpt_command *)0x0) {
      iVar1 = -1;
    }
    else {
      iVar1 = (int)((ulong)((long)pmVar2 + (-0x20 - (long)(disp->_d)._buf)) >> 3) * -0x55555555;
      (*pmVar2->cmd)(pmVar2->arg,(void *)0x0);
      pmVar2->cmd = (_func_int_void_ptr_void_ptr *)0x0;
      pmVar2->arg = (void *)0x0;
    }
  }
  else {
    iVar1 = -1;
    if (pmVar2 == (mpt_command *)0x0) {
      iVar1 = mpt_command_set(&disp->_d,id,(_func_int_void_ptr_void_ptr *)cmd,arg);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

extern int mpt_dispatch_set(MPT_STRUCT(dispatch) *disp, uintptr_t id, MPT_TYPE(event_handler) cmd, void *arg)
{
	MPT_STRUCT(command) *dst = mpt_command_get(&disp->_d, id);
	
	/* clear registration */
	if (!cmd) {
		int pos;
		if (!dst) {
			return MPT_ERROR(BadArgument);
		}
		pos = dst - ((MPT_STRUCT(command) *) (disp->_d._buf + 1));
		dst->cmd(dst->arg, 0);
		dst->cmd = 0;
		dst->arg = 0;
		return pos;
	}
	/* id already used */
	if (dst) {
		return MPT_ERROR(BadArgument);
	}
	/* register command */
	return mpt_command_set(&disp->_d, id, (int (*)()) cmd, arg);
}